

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O0

void * parseList(SymbolContext<char> *ctx)

{
  int iVar1;
  list<JSONValue,_std::allocator<JSONValue>_> *this;
  JSONValue *pJVar2;
  JSONValue *v;
  int i;
  JSONList *l;
  SymbolContext<char> *ctx_local;
  
  this = (list<JSONValue,_std::allocator<JSONValue>_> *)operator_new(0x18);
  memset(this,0,0x18);
  std::__cxx11::list<JSONValue,_std::allocator<JSONValue>_>::list(this);
  v._4_4_ = 1;
  while( true ) {
    iVar1 = Centaurus::SymbolContext<char>::count(ctx);
    if (iVar1 < v._4_4_) break;
    pJVar2 = Centaurus::SymbolContext<char>::value<JSONValue>(ctx,v._4_4_);
    std::__cxx11::list<JSONValue,_std::allocator<JSONValue>_>::emplace_back<JSONValue>(this,pJVar2);
    if (pJVar2 != (JSONValue *)0x0) {
      JSONValue::~JSONValue(pJVar2);
      operator_delete(pJVar2);
    }
    v._4_4_ = v._4_4_ + 1;
  }
  pJVar2 = (JSONValue *)operator_new(0x10);
  JSONValue::JSONValue(pJVar2,this);
  return pJVar2;
}

Assistant:

void *parseList(const SymbolContext<char>& ctx)
{
    JSONList *l = new JSONList();
    for (int i = 1; i <= ctx.count(); i++)
    {
        JSONValue *v = ctx.value<JSONValue>(i);
        l->emplace_back(std::move(*v));
        delete v;
    }
    return new JSONValue(l); 
}